

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<Token,_std::allocator<Token>_> *
Tokenizer::tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,string *str,
                   NumberType *numberType)

{
  TokenType TVar1;
  char value1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  bool bVar10;
  Token local_2e0;
  Token local_290;
  char local_239;
  string local_238;
  Token local_218;
  ulong local_1c8;
  size_t next;
  long local_1b8;
  undefined8 local_1b0;
  string local_1a8 [8];
  string identifier;
  Token local_138;
  Token local_e8;
  Token local_98;
  char local_31;
  ulong uStack_30;
  char current;
  size_t i;
  NumberType *local_20;
  NumberType *numberType_local;
  string *str_local;
  vector<Token,_std::allocator<Token>_> *tokens;
  
  i._7_1_ = 0;
  local_20 = numberType;
  numberType_local = (NumberType *)str;
  str_local = (string *)__return_storage_ptr__;
  std::vector<Token,_std::allocator<Token>_>::vector(__return_storage_ptr__);
  uStack_30 = 0;
  do {
    uVar6 = uStack_30;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar6) {
      return __return_storage_ptr__;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
    local_31 = *pcVar5;
    iVar2 = isspace((int)local_31);
    if (iVar2 == 0) {
      if (local_31 == '(') {
        Token::Token(&local_98,LEFT_PARENTHESIS);
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_98);
        Token::~Token(&local_98);
      }
      else if (local_31 == ')') {
        Token::Token(&local_e8,RIGHT_PARENTHESIS);
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_e8);
        Token::~Token(&local_e8);
      }
      else if (local_31 == ',') {
        Token::Token(&local_138,COMMA);
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_138);
        Token::~Token(&local_138);
      }
      else {
        uVar3 = (*local_20->_vptr_NumberType[5])(local_20,str,(ulong)(uint)(int)local_31,uStack_30);
        if ((uVar3 & 1) == 0) {
          iVar2 = isalpha((int)local_31);
          if (iVar2 == 0) {
            sVar7 = std::vector<Token,_std::allocator<Token>_>::size(__return_storage_ptr__);
            bVar10 = false;
            if (sVar7 != 0) {
              pvVar8 = std::vector<Token,_std::allocator<Token>_>::back(__return_storage_ptr__);
              TVar1 = Token::type(pvVar8);
              bVar10 = false;
              if (TVar1 == OPERATOR) {
                pvVar8 = std::vector<Token,_std::allocator<Token>_>::back(__return_storage_ptr__);
                local_239 = Token::charValue(pvVar8);
                sVar9 = std::
                        unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
                        ::count((unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
                                 *)(anonymous_namespace)::twoCharOps,&local_239);
                bVar10 = sVar9 != 0;
              }
            }
            if (bVar10) {
              pvVar8 = std::vector<Token,_std::allocator<Token>_>::back(__return_storage_ptr__);
              value1 = Token::charValue(pvVar8);
              Token::Token(&local_290,TWO_CHAR_OPERATOR,value1,local_31);
              pvVar8 = std::vector<Token,_std::allocator<Token>_>::back(__return_storage_ptr__);
              Token::operator=(pvVar8,&local_290);
              Token::~Token(&local_290);
            }
            else {
              Token::Token(&local_2e0,OPERATOR,local_31);
              std::vector<Token,_std::allocator<Token>_>::push_back
                        (__return_storage_ptr__,&local_2e0);
              Token::~Token(&local_2e0);
            }
          }
          else {
            next._7_1_ = local_31;
            local_1b8 = (long)&next + 7;
            local_1b0 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a8,local_1b8,local_1b0,(long)&next + 6);
            std::allocator<char>::~allocator((allocator<char> *)((long)&next + 6));
            while( true ) {
              uVar6 = uStack_30 + 1;
              local_1c8 = uVar6;
              uVar4 = std::__cxx11::string::size();
              if (uVar4 <= uVar6) break;
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
              local_31 = *pcVar5;
              iVar2 = isdigit((int)local_31);
              if ((iVar2 == 0) && (iVar2 = isalpha((int)local_31), iVar2 == 0)) break;
              std::__cxx11::string::operator+=(local_1a8,local_31);
              uStack_30 = local_1c8;
            }
            std::__cxx11::string::string((string *)&local_238,local_1a8);
            Token::Token(&local_218,&local_238);
            std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_218)
            ;
            Token::~Token(&local_218);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string(local_1a8);
          }
        }
        else {
          (*local_20->_vptr_NumberType[6])
                    ((undefined1 *)((long)&identifier.field_2 + 8),local_20,str,&local_31,
                     &stack0xffffffffffffffd0);
          std::vector<Token,_std::allocator<Token>_>::push_back
                    (__return_storage_ptr__,(value_type *)((long)&identifier.field_2 + 8));
          Token::~Token((Token *)((long)&identifier.field_2 + 8));
        }
      }
    }
    uStack_30 = uStack_30 + 1;
  } while( true );
}

Assistant:

std::vector<Token> Tokenizer::tokenize(std::string str, NumberType& numberType) {
	std::vector<Token> tokens;
	for (std::size_t i = 0; i < str.size(); i++) {
		char current = str[i];

		//Skip whitespaces
		if (isspace(current)) {
			continue;
		}

		//Parenthesis
		if (current == '(') {
			tokens.push_back({ TokenType::LEFT_PARENTHESIS });
			continue;
		}

		if (current == ')') {
			tokens.push_back({ TokenType::RIGHT_PARENTHESIS });
			continue;
		}

		//Comma
		if (current == ',') {
			tokens.push_back({ TokenType::COMMA });
			continue;
		}

		//Number
		if (numberType.isStartOfNumber(str, current, i)) {
			tokens.push_back(numberType.parseNumber(str, current, i));
			continue;
		}

		//Identifier
		if (isalpha(current)) {
			std::string identifier { current };

			while (true) {
				std::size_t next = i + 1;

				if (next >= str.size()) {
					break;
				}

				current = str[next];

				if (!(isdigit(current) || isalpha(current))) {
					break;
				}

				identifier += current;
				i = next;
			}

			tokens.push_back(Token(identifier));
			continue;
		}

		//Operator
		if (tokens.size() > 0 && tokens.back().type() == TokenType::OPERATOR
			&& twoCharOps.count(tokens.back().charValue()) > 0) {
			//If the previous token is an operator and the current one also is, upgrade to a two-op char
			tokens.back() = { TokenType::TWO_CHAR_OPERATOR, tokens.back().charValue(), current };
		} else {
			tokens.push_back({ TokenType::OPERATOR, current });
		}
	}

	return tokens;
}